

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.cpp
# Opt level: O1

void __thiscall
chrono::ChBodyEasySphere::SetupBody
          (ChBodyEasySphere *this,double radius,double density,bool visualize,bool collide,
          shared_ptr<chrono::ChMaterialSurface> *material)

{
  element_type *peVar1;
  ChSphereShape *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined7 in_register_00000011;
  ChVector<double> *iner;
  double dVar3;
  shared_ptr<chrono::ChSphereShape> vshape;
  shared_ptr<chrono::ChVisualModel> local_118;
  shared_ptr<chrono::ChVisualShape> local_108;
  ChSphereShape *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  element_type *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  _func_int **local_d8;
  double local_d0;
  undefined1 local_c8 [24];
  double local_b0;
  undefined1 local_a8 [16];
  _func_int **local_98;
  double local_90;
  double local_88;
  undefined1 local_80 [16];
  double local_70;
  ChMatrix33<double> local_68;
  
  local_d0 = density;
  dVar3 = pow(radius,3.0);
  dVar3 = dVar3 * 4.1887902047863905 * local_d0;
  local_d8 = (_func_int **)(radius * radius * dVar3 * 0.4);
  (this->super_ChBody).density = (float)local_d0;
  ChVariablesBodyOwnMass::SetBodyMass(&(this->super_ChBody).variables,dVar3);
  iner = (ChVector<double> *)local_a8;
  local_a8._0_8_ = local_d8;
  local_a8._8_8_ = local_d8;
  local_98 = local_d8;
  ChBody::SetInertiaXX(&this->super_ChBody,iner);
  if ((int)CONCAT71(in_register_00000011,collide) != 0) {
    if ((material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        == (element_type *)0x0) {
      __assert_fail("material",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChBodyEasy.cpp"
                    ,0x3f,
                    "void chrono::ChBodyEasySphere::SetupBody(double, double, bool, bool, std::shared_ptr<ChMaterialSurface>)"
                   );
    }
    peVar1 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var2 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (*peVar1->_vptr_ChCollisionModel[3])();
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    peVar1 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var2 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    local_e8 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr;
    local_e0 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
               ._M_refcount._M_pi;
    if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_e0->_M_use_count = local_e0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_e0->_M_use_count = local_e0->_M_use_count + 1;
      }
    }
    local_a8._0_8_ = (_func_int **)0x0;
    local_a8._8_8_ = (_func_int **)0x0;
    local_98 = (_func_int **)0x0;
    (*peVar1->_vptr_ChCollisionModel[5])(radius,peVar1,&local_e8);
    if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
    }
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    peVar1 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var2 = (this->super_ChBody).collision_model.
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (*peVar1->_vptr_ChCollisionModel[4])();
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    iner = (ChVector<double> *)0x1;
    ChBody::SetCollide(&this->super_ChBody,true);
  }
  if (visualize) {
    this_00 = (ChSphereShape *)ChVisualShape::operator_new((ChVisualShape *)0x38,(size_t)iner);
    ChSphereShape::ChSphereShape(this_00);
    local_f8 = this_00;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChSphereShape*>
              (&local_f0,this_00);
    (local_f8->gsphere).rad = radius;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x40);
    p_Var2->_M_use_count = 1;
    p_Var2->_M_weak_count = 1;
    p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b33b18;
    p_Var2[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var2[1]._M_use_count = 0;
    p_Var2[1]._M_weak_count = 0;
    p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var2[2]._M_use_count = 0;
    p_Var2[2]._M_weak_count = 0;
    p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var2[2]._M_use_count = 0;
    p_Var2[2]._M_weak_count = 0;
    p_Var2[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var2[3]._M_use_count = 0;
    p_Var2[3]._M_weak_count = 0;
    local_108.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_f8->super_ChVisualShape;
    local_108.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_f0._M_pi;
    if (local_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_f0._M_pi)->_M_use_count = (local_f0._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_f0._M_pi)->_M_use_count = (local_f0._M_pi)->_M_use_count + 1;
      }
    }
    local_c8._0_8_ = 1.0;
    local_c8._8_16_ = ZEXT416(0) << 0x40;
    local_b0 = 0.0;
    local_a8._0_8_ = &PTR__ChFrame_00b2b308;
    local_90 = 0.0;
    local_88 = 1.0;
    local_70 = 0.0;
    unique0x100007d7 = local_c8._8_16_;
    local_80 = local_c8._8_16_;
    ChMatrix33<double>::ChMatrix33(&local_68,(ChQuaternion<double> *)local_c8);
    ChVisualModel::AddShape((ChVisualModel *)(p_Var2 + 1),&local_108,(ChFrame<double> *)local_a8);
    if (local_108.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_108.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
    local_118.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (ChVisualModel *)(p_Var2 + 1);
    local_118.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var2;
    ChPhysicsItem::AddVisualModel((ChPhysicsItem *)this,&local_118);
    if (local_118.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_118.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if (local_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0._M_pi);
    }
  }
  return;
}

Assistant:

void ChBodyEasySphere::SetupBody(double radius,
                                 double density,
                                 bool visualize,
                                 bool collide,
                                 std::shared_ptr<ChMaterialSurface> material) {
    double mmass = density * ((4.0 / 3.0) * CH_C_PI * pow(radius, 3));
    double inertia = (2.0 / 5.0) * mmass * pow(radius, 2);

    this->SetDensity((float)density);
    this->SetMass(mmass);
    this->SetInertiaXX(ChVector<>(inertia, inertia, inertia));

    if (collide) {
        assert(material);
        GetCollisionModel()->ClearModel();
        GetCollisionModel()->AddSphere(material, radius);
        GetCollisionModel()->BuildModel();
        SetCollide(true);
    }
    if (visualize) {
        auto vshape = chrono_types::make_shared<ChSphereShape>();
        vshape->GetSphereGeometry().rad = radius;
        auto vmodel = chrono_types::make_shared<ChVisualModel>();
        vmodel->AddShape(vshape);
        this->AddVisualModel(vmodel);
    }
}